

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryGetParent
          (InMemoryDirectory *this,StringPtr name,WriteMode mode)

{
  Disposer *ctx;
  Predicate *pPVar1;
  Directory *extraout_RDX;
  uint in_R8D;
  void *__arg;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar2;
  StringPtr name_00;
  Fault f;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Own<const_kj::Directory,_std::nullptr_t> local_58;
  Own<const_kj::Directory,_std::nullptr_t> local_48;
  undefined8 local_30;
  void *__child_stack;
  
  name_00.content.size_ = name.content.size_;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
             &stack0xffffffffffffffc8,name.content.ptr + 0x18);
  __arg = (void *)(ulong)(((~in_R8D & 5) == 0) + 2);
  name_00.content.ptr = (char *)local_30;
  Impl::openEntry((Impl *)&local_58,name_00,mode);
  ctx = local_58.disposer;
  if ((EVP_PKEY_CTX *)local_58.disposer != (EVP_PKEY_CTX *)0x0) {
    if (*(int *)((long)local_58.disposer + 0x18) == 0) {
      pPVar1 = (Predicate *)(**(code **)**(undefined8 **)local_30)();
      *(Predicate **)(local_30 + 0x40) = pPVar1;
      Impl::newDirectory((Impl *)&local_48);
      EntryImpl::init((EntryImpl *)&local_58,(EVP_PKEY_CTX *)ctx);
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)local_58.disposer;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_58.ptr;
      local_58.ptr = (Directory *)0x0;
      Own<const_kj::Directory,_std::nullptr_t>::dispose(&local_58);
      Own<const_kj::Directory,_std::nullptr_t>::dispose(&local_48);
      goto LAB_00415c88;
    }
    if (*(int *)((long)local_58.disposer + 0x18) == 2) {
      Directory::clone((Directory *)&local_58,*(__fn **)((long)local_58.disposer + 0x28),
                       __child_stack,mode,__arg);
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)local_58.disposer;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_58.ptr;
      local_58.ptr = (Directory *)0x0;
      Own<const_kj::Directory,_std::nullptr_t>::dispose(&local_58);
      goto LAB_00415c88;
    }
  }
  if ((in_R8D & 1) == 0) {
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x6f1,FAILED,(char *)0x0,"\"parent is not a directory\"",
               (char (*) [26])"parent is not a directory");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)&local_58);
  }
LAB_00415c88:
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
            ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&stack0xffffffffffffffc8)
  ;
  MVar2.ptr.ptr = extraout_RDX;
  MVar2.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<Own<const Directory>> tryGetParent(kj::StringPtr name, WriteMode mode) const {
    // Get a directory which is a parent of the eventual target. If `mode` includes
    // WriteMode::CREATE_PARENTS, possibly create the parent directory.

    auto lock = impl.lockExclusive();

    WriteMode parentMode = has(mode, WriteMode::CREATE) && has(mode, WriteMode::CREATE_PARENT)
        ? WriteMode::CREATE | WriteMode::MODIFY   // create parent
        : WriteMode::MODIFY;                      // don't create parent

    // Possibly create parent.
    KJ_IF_SOME(entry, lock->openEntry(name, parentMode)) {
      if (entry.node.is<DirectoryNode>()) {
        return entry.node.get<DirectoryNode>().directory->clone();
      } else if (entry.node == nullptr) {
        lock->modified();
        return entry.init(DirectoryNode { lock->newDirectory() });
      }
      // Continue on.
    }

    if (has(mode, WriteMode::CREATE)) {
      // CREATE is documented as returning null when the file already exists. In this case, the
      // file does NOT exist because the parent directory does not exist or is not a directory.
      KJ_FAIL_REQUIRE("parent is not a directory") { return kj::none; }
    } else {
      return kj::none;
    }
  }